

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_tilt(YPSpur *spur,int cs,double dir,double tilt)

{
  int iVar1;
  undefined1 local_68 [8];
  YPSpur_msg msg;
  double tilt_local;
  double dir_local;
  int cs_local;
  YPSpur *spur_local;
  
  local_68 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x56;
  msg.pid._4_4_ = cs;
  msg._16_8_ = dir;
  msg.data[0] = tilt;
  msg.data[3] = tilt;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_68);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_tilt(YPSpur* spur, int cs, double dir, double tilt)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_SET_TILT;
  msg.data[0] = dir;
  msg.data[1] = tilt;
  msg.cs = cs;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}